

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::EqualTest<unsigned_int,unsigned_long_long>(void)

{
  int local_44;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_40;
  int local_3c;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_38;
  int local_34 [2];
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2c;
  int local_28;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_24;
  int local_20;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1c;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_18;
  
  local_20 = 3;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_1c,&local_20);
  if (local_1c.m_int == 2) {
    local_28 = 4;
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_24,&local_28);
    if (local_24.m_int == 5) {
      local_34[1] = 6;
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_2c,local_34 + 1);
      local_34[0] = 7;
      SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::
      SafeInt<int>(&local_18,local_34);
      if (local_18.m_int == local_2c.m_int) {
        local_3c = 1;
        SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                  (&local_38,&local_3c);
        if (local_38.m_int != 0) {
          local_44 = 0;
          SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                    (&local_40,&local_44);
          return local_40.m_int == 0;
        }
      }
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool EqualTest()
	{
		return
			(U)2 == SafeInt<T>(3) &&
			SafeInt<T>(4) == (U)5 &&
			SafeInt<T>(6) == SafeInt<U>(7) &&
			true == SafeInt<T>(1) &&
			false == SafeInt<T>(0);
	}